

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O2

void __thiscall xLearn::Model::Serialize(Model *this,string *filename)

{
  FILE *file_ptr;
  ostream *poVar1;
  allocator local_5e;
  allocator local_5d;
  Logger local_5c;
  string local_58;
  string local_38;
  
  if (filename->_M_string_length != 0) {
    file_ptr = OpenFileOrDie((filename->_M_dataplus)._M_p,"w");
    WriteStringToFile(file_ptr,&this->score_func_);
    WriteStringToFile(file_ptr,&this->loss_func_);
    WriteDataToDisk(file_ptr,(char *)&this->num_feat_,4);
    WriteDataToDisk(file_ptr,(char *)&this->num_field_,4);
    WriteDataToDisk(file_ptr,(char *)&this->num_K_,4);
    WriteDataToDisk(file_ptr,(char *)&this->aux_size_,4);
    serialize_w_v_b(this,file_ptr);
    Close(file_ptr);
    return;
  }
  local_5c.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters.cc"
             ,&local_5d);
  std::__cxx11::string::string((string *)&local_58,"Serialize",&local_5e);
  poVar1 = Logger::Start(ERR,&local_38,0xd6,&local_58);
  poVar1 = std::operator<<(poVar1,"CHECK_NE failed ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters.cc"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xd6);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"filename.empty()");
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"true");
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  Logger::~Logger(&local_5c);
  abort();
}

Assistant:

void Model::Serialize(const std::string& filename) {
  CHECK_NE(filename.empty(), true);
#ifndef _MSC_VER
  FILE* file = OpenFileOrDie(filename.c_str(), "w");
#else
  FILE *file = OpenFileOrDie(filename.c_str(), "wb");
#endif
  // Write score function
  WriteStringToFile(file, score_func_);
  // Write loss function
  WriteStringToFile(file, loss_func_);
  // Write feature num
  WriteDataToDisk(file, (char*)&num_feat_, sizeof(num_feat_));
  // Write field num
  WriteDataToDisk(file, (char*)&num_field_, sizeof(num_field_));
  // Write K
  WriteDataToDisk(file, (char*)&num_K_, sizeof(num_K_));
  // Write aux_size
  WriteDataToDisk(file, (char*)&aux_size_, sizeof(aux_size_));
  // Write w
  this->serialize_w_v_b(file);
  Close(file);
}